

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

uint32_t MurmurHash3_x86_32(void *key,int len,uint32_t seed)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  byte *pbVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint32_t k1;
  uint8_t *tail;
  uint32_t k1_1;
  uint32_t *blocks;
  uint32_t c2;
  uint32_t c1;
  uint32_t h1;
  int i;
  int nblocks;
  uint8_t *data;
  uint local_4c;
  uint local_24;
  int local_20;
  
  iVar1 = (int)in_ESI / 4;
  local_24 = in_EDX;
  for (local_20 = -iVar1; local_20 != 0; local_20 = local_20 + 1) {
    uVar2 = rotl32(*(int *)(in_RDI + (iVar1 << 2) + (long)local_20 * 4) * -0x3361d2af,'\x0f');
    uVar2 = rotl32(uVar2 * 0x1b873593 ^ local_24,'\r');
    local_24 = uVar2 * 5 + 0xe6546b64;
  }
  pbVar4 = (byte *)(in_RDI + (iVar1 << 2));
  local_4c = 0;
  uVar3 = in_ESI & 3;
  if (uVar3 != 1) {
    if (uVar3 != 2) {
      if (uVar3 != 3) goto LAB_00111b18;
      local_4c = (uint)pbVar4[2] << 0x10;
    }
    local_4c = (uint)pbVar4[1] << 8 ^ local_4c;
  }
  uVar2 = rotl32((*pbVar4 ^ local_4c) * -0x3361d2af,'\x0f');
  local_24 = uVar2 * 0x1b873593 ^ local_24;
LAB_00111b18:
  uVar2 = fmix32(in_ESI ^ local_24);
  return uVar2;
}

Assistant:

uint32_t inline MurmurHash3_x86_32(const void* key, int len, uint32_t seed) {
	const uint8_t* data = (const uint8_t*)key;
	const int nblocks = len / 4;
	int i;

	uint32_t h1 = seed;

	uint32_t c1 = 0xcc9e2d51;
	uint32_t c2 = 0x1b873593;

	//----------
	// body

	const uint32_t* blocks = (const uint32_t*)(data + nblocks * 4);

	for (i = -nblocks; i; i++) {
		uint32_t k1 = getblock(blocks, i);

		k1 *= c1;
		k1 = ROTL32(k1, 15);
		k1 *= c2;

		h1 ^= k1;
		h1 = ROTL32(h1, 13);
		h1 = h1 * 5 + 0xe6546b64;
	}

	//----------
	// tail

	const uint8_t* tail = (const uint8_t*)(data + nblocks * 4);

	uint32_t k1 = 0;

	switch (len & 3) {
	case 3:
		k1 ^= tail[2] << 16;
	case 2:
		k1 ^= tail[1] << 8;
	case 1:
		k1 ^= tail[0];
		k1 *= c1;
		k1 = ROTL32(k1, 15);
		k1 *= c2;
		h1 ^= k1;
	};

	//----------
	// finalization

	h1 ^= len;

	h1 = fmix32(h1);

	return h1;
}